

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
process_hex(Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  bool bVar1;
  longlong lVar2;
  longlong val;
  Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  bVar1 = Catch::clara::std::__cxx11::
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->hex_matches);
  if (!bVar1) {
    lVar2 = Catch::clara::std::__cxx11::stoll(&this->hex_matches,(size_t *)0x0,0x10);
    Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    push_back(this->match,(char)lVar2);
  }
  Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  clear(&this->hex_matches);
  this->is_escaped = false;
  this->is_hex = false;
  return;
}

Assistant:

void process_hex() {
          if (!hex_matches.empty()) {
            auto val = stoll(hex_matches, nullptr, 16);
            match.push_back(char_type(val));
          }
          hex_matches.clear();
          is_escaped = false;
          is_hex = false;
        }